

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.cpp
# Opt level: O2

void * uprv_malloc_63(size_t s)

{
  void *pvVar1;
  
  if (s == 0) {
    return zeroMem;
  }
  if (pAlloc != (UMemAllocFn *)0x0) {
    pvVar1 = (*pAlloc)(pContext,s);
    return pvVar1;
  }
  pvVar1 = malloc(s);
  return pvVar1;
}

Assistant:

U_CAPI void * U_EXPORT2
uprv_malloc(size_t s) {
#if U_DEBUG && defined(UPRV_MALLOC_COUNT)
#if 1
  putchar('>');
  fflush(stdout);
#else
  fprintf(stderr,"MALLOC\t#%d\t%ul bytes\t%ul total\n", ++n,s,(b+=s)); fflush(stderr);
#endif
#endif
    if (s > 0) {
        if (pAlloc) {
            return (*pAlloc)(pContext, s);
        } else {
            return uprv_default_malloc(s);
        }
    } else {
        return (void *)zeroMem;
    }
}